

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

int utflen(lua_State *L)

{
  size_t in_RAX;
  char *pcVar1;
  long lVar2;
  lua_Integer lVar3;
  char *pcVar4;
  int iVar5;
  lua_Integer n;
  size_t len;
  
  len = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&len);
  iVar5 = 2;
  lVar2 = luaL_optinteger(L,2,1);
  if (lVar2 < 0) {
    if (len < (ulong)-lVar2) {
      lVar2 = 0;
    }
    else {
      lVar2 = lVar2 + len + 1;
    }
  }
  lVar3 = luaL_optinteger(L,3,-1);
  if (lVar3 < 0) {
    if (len < (ulong)-lVar3) {
      lVar3 = 0;
    }
    else {
      lVar3 = lVar3 + len + 1;
    }
  }
  if ((lVar2 < 1) || (lVar2 = lVar2 + -1, (long)len < lVar2)) {
    luaL_argerror(L,2,"initial position out of string");
  }
  if ((long)len < lVar3) {
    luaL_argerror(L,3,"final position out of string");
  }
  n = 0;
  do {
    if (lVar3 <= lVar2) {
      iVar5 = 1;
LAB_00119aee:
      lua_pushinteger(L,n);
      return iVar5;
    }
    pcVar4 = utf8_decode(pcVar1 + lVar2,(int *)0x0);
    if (pcVar4 == (char *)0x0) {
      lua_pushnil(L);
      n = lVar2 + 1;
      goto LAB_00119aee;
    }
    lVar2 = (long)pcVar4 - (long)pcVar1;
    n = n + 1;
  } while( true );
}

Assistant:

static int utflen(lua_State *L) {
    int n = 0;
    size_t len;
    const char *s = luaL_checklstring(L, 1, &len);
    lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
    lua_Integer posj = u_posrelat(luaL_optinteger(L, 3, -1), len);
    luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer) len, 2,
                  "initial position out of string");
    luaL_argcheck(L, --posj < (lua_Integer) len, 3,
                  "final position out of string");
    while (posi <= posj) {
        const char *s1 = utf8_decode(s + posi, NULL);
        if (s1 == NULL) {  /* conversion error? */
            lua_pushnil(L);  /* return nil ... */
            lua_pushinteger(L, posi + 1);  /* ... and current position */
            return 2;
        }
        posi = s1 - s;
        n++;
    }
    lua_pushinteger(L, n);
    return 1;
}